

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_writer.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_writer::write_application_data_segment
          (jpeg_stream_writer *this,int32_t application_data_id,const_byte_span application_data)

{
  const_byte_span data;
  size_t data_size;
  bool local_39;
  int32_t application_data_id_local;
  jpeg_stream_writer *this_local;
  const_byte_span application_data_local;
  
  application_data_local.data_ = (uint8_t *)application_data.size_;
  this_local = (jpeg_stream_writer *)application_data.data_;
  local_39 = 0xf < (uint)application_data_id;
  if (local_39) {
    __assert_fail("application_data_id >= minimum_application_data_id && application_data_id <= maximum_application_data_id"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.cpp"
                  ,0x8c,
                  "void charls::jpeg_stream_writer::write_application_data_segment(const int32_t, const const_byte_span)"
                 );
  }
  data_size = const_byte_span::size((const_byte_span *)&this_local);
  write_segment_header(this,(char)application_data_id - 0x20,data_size);
  data.size_ = (size_t)application_data_local.data_;
  data.data_ = (uint8_t *)this_local;
  write_bytes(this,data);
  return;
}

Assistant:

void jpeg_stream_writer::write_application_data_segment(const int32_t application_data_id, const const_byte_span application_data)
{
    ASSERT(application_data_id >= minimum_application_data_id && application_data_id <= maximum_application_data_id);

    write_segment_header(
        static_cast<jpeg_marker_code>(static_cast<int32_t>(jpeg_marker_code::application_data0) + application_data_id),
        application_data.size());
    write_bytes(application_data);
}